

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void check_leaf_list_backlinks(lyd_node *node,int op)

{
  uint8_t *puVar1;
  lys_node *plVar2;
  lys_node *leaf;
  bool bVar3;
  ly_set *__ptr;
  lyd_node *plVar4;
  lyd_node *plVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (2 < (uint)op) {
    __assert_fail("(op == 0) || (op == 1) || (op == 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x531,"void check_leaf_list_backlinks(struct lyd_node *, int)");
  }
  if (node != (lyd_node *)0x0) {
    bVar3 = false;
    plVar5 = node;
    do {
      if ((((plVar5->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
          (plVar2 = plVar5->schema->child, plVar2 != (lys_node *)0x0)) &&
         (*(int *)((long)&plVar2->name + 4) != 0)) {
        uVar6 = 0;
        do {
          __ptr = lyd_find_instance(plVar5,*(lys_node **)(plVar2->dsc + uVar6 * 8));
          if (__ptr == (ly_set *)0x0) {
            ly_log(node->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                   ,0x54b);
            return;
          }
          if (__ptr->number != 0) {
            uVar7 = 0;
            do {
              leaf = (__ptr->set).s[uVar7];
              if (op == 0) {
LAB_00167a8f:
                if (((ulong)leaf->child & 0x100000000) != 0) {
LAB_00167a95:
                  *(byte *)&leaf->dsc = *(byte *)&leaf->dsc | 8;
                  bVar3 = true;
                  if (*(LY_DATA_TYPE *)&leaf->child == LY_TYPE_LEAFREF) {
                    lyp_parse_value((lys_type *)&((lys_node *)leaf->name)[1].ref,
                                    (char **)&leaf->nodetype,(lyxml_elem *)0x0,
                                    (lyd_node_leaf_list *)leaf,(lyd_attr *)0x0,(lys_module *)0x0,1,
                                    *(byte *)((long)&leaf->dsc + 1) & 1,0);
                  }
                }
              }
              else {
                if ((*(LY_DATA_TYPE *)&leaf->child == LY_TYPE_LEAFREF) &&
                   ((lyd_node *)((lyd_val *)&leaf->parent)->binary == plVar5)) goto LAB_00167a95;
                if (op != 1) goto LAB_00167a8f;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < __ptr->number);
          }
          free((__ptr->set).s);
          free(__ptr);
          uVar6 = uVar6 + 1;
        } while (uVar6 < *(uint *)((long)&plVar2->name + 4));
      }
      if ((plVar5->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar4 = plVar5->child;
      }
      else {
        plVar4 = (lyd_node *)0x0;
      }
      if (plVar4 == (lyd_node *)0x0) {
        if (plVar5 == node) break;
        plVar4 = plVar5->next;
      }
      if (plVar4 == (lyd_node *)0x0) {
        for (plVar5 = plVar5->parent;
            (plVar5->parent != node->parent && (plVar4 = plVar5->next, plVar4 == (lyd_node *)0x0));
            plVar5 = plVar5->parent) {
        }
      }
      plVar5 = plVar4;
    } while (plVar4 != (lyd_node *)0x0);
    if ((bVar3) && (node->parent != (lyd_node *)0x0)) {
      puVar1 = &node->parent->validity;
      *puVar1 = *puVar1 | 4;
    }
  }
  return;
}

Assistant:

static void
check_leaf_list_backlinks(struct lyd_node *node, int op)
{
    struct lyd_node *next, *iter;
    struct lyd_node_leaf_list *leaf_list;
    struct ly_set *set, *data;
    uint32_t i, j;
    int validity_changed = 0;

    assert((op == 0) || (op == 1) || (op == 2));

    /* fix leafrefs */
    LY_TREE_DFS_BEGIN(node, next, iter) {
        /* the node is target of a leafref */
        if ((iter->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && iter->schema->child) {
            set = (struct ly_set *)iter->schema->child;
            for (i = 0; i < set->number; i++) {
                data = lyd_find_instance(iter, set->set.s[i]);
                if (data) {
                    for (j = 0; j < data->number; j++) {
                        leaf_list = (struct lyd_node_leaf_list *)data->set.d[j];
                        if (((op != 0) && (leaf_list->value_type == LY_TYPE_LEAFREF) && (leaf_list->value.leafref == iter))
                                || ((op != 1) && (leaf_list->value_flags & LY_VALUE_UNRES))) {
                            /* invalidate the leafref, a change concerning it happened */
                            leaf_list->validity |= LYD_VAL_LEAFREF;
                            validity_changed = 1;
                            if (leaf_list->value_type == LY_TYPE_LEAFREF) {
                                /* remove invalid link and put unresolved value back */
                                lyp_parse_value(&((struct lys_node_leaf *)leaf_list->schema)->type, &leaf_list->value_str,
                                                NULL, leaf_list, NULL, NULL, 1, leaf_list->dflt, 0);
                            }
                        }
                    }
                    ly_set_free(data);
                } else {
                    LOGINT(node->schema->module->ctx);
                    return;
                }
            }
        }
        LY_TREE_DFS_END(node, next, iter)
    }

    /* invalidate parent to make sure it will be checked in future validation */
    if (validity_changed && node->parent) {
        node->parent->validity |= LYD_VAL_MAND;
    }
}